

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O3

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabled<(Memory::ObjectInfoBits)133>(HeapInfo *this,size_t size)

{
  ulong sizeCat;
  
  if (this->isPageHeapEnabled == true) {
    sizeCat = size + 0xf & 0xfffffffffffffff0;
    if (size < 0x301) {
      GetBucket<(Memory::ObjectInfoBits)128>(this,sizeCat);
    }
    else if (size - 0x301 < 0x1d00) {
      GetMediumBucketIndex(sizeCat);
    }
  }
  return false;
}

Assistant:

bool IsPageHeapEnabled(size_t size)
    {
        if (IsPageHeapEnabled())
        {
            size_t sizeCat = HeapInfo::GetAlignedSizeNoCheck(size);
            if (HeapInfo::IsSmallObject(size))
            {
                auto& bucket = this->GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
                return bucket.IsPageHeapEnabled(attributes);
            }
            else if (HeapInfo::IsMediumObject(size))
            {
                auto& bucket = this->GetMediumBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
                return bucket.IsPageHeapEnabled(attributes);
            }
            else
            {
                return this->largeObjectBucket.IsPageHeapEnabled(attributes);
            }
        }
        return false;
    }